

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFCommon.cpp
# Opt level: O0

size_t glTFCommon::Util::DecodeBase64(char *in,size_t inLength,uint8_t **out)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint8_t *puVar5;
  long lVar6;
  uint8_t b3_1;
  uint8_t b2_1;
  uint8_t b1_1;
  uint8_t b0_1;
  uint8_t b3;
  uint8_t b2;
  uint8_t b1;
  uint8_t b0;
  size_t j;
  size_t i;
  size_t outLength;
  int nEquals;
  uint8_t **out_local;
  size_t inLength_local;
  char *in_local;
  
  if ((inLength & 3) != 0) {
    __assert_fail("inLength % 4 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/glTF/glTFCommon.cpp"
                  ,0x32,"size_t glTFCommon::Util::DecodeBase64(const char *, size_t, uint8_t *&)");
  }
  if (inLength < 4) {
    *out = (uint8_t *)0x0;
    in_local = (char *)0x0;
  }
  else {
    in_local = (char *)((inLength * 3 >> 2) -
                       (long)(int)((uint)(in[inLength - 1] == '=') + (uint)(in[inLength - 2] == '=')
                                  ));
    puVar5 = (uint8_t *)operator_new__((ulong)in_local);
    *out = puVar5;
    memset(*out,0,(size_t)in_local);
    _b3_1 = 0;
    for (j = 0; j + 4 < inLength; j = j + 4) {
      uVar1 = DecodeCharBase64(in[j]);
      bVar2 = DecodeCharBase64(in[j + 1]);
      bVar3 = DecodeCharBase64(in[j + 2]);
      bVar4 = DecodeCharBase64(in[j + 3]);
      (*out)[_b3_1] = uVar1 << 2 | (byte)((int)(uint)bVar2 >> 4);
      lVar6 = _b3_1 + 2;
      (*out)[_b3_1 + 1] = bVar2 << 4 | (byte)((int)(uint)bVar3 >> 2);
      _b3_1 = _b3_1 + 3;
      (*out)[lVar6] = bVar3 << 6 | bVar4;
    }
    uVar1 = DecodeCharBase64(in[j]);
    bVar2 = DecodeCharBase64(in[j + 1]);
    bVar3 = DecodeCharBase64(in[j + 2]);
    bVar4 = DecodeCharBase64(in[j + 3]);
    (*out)[_b3_1] = uVar1 << 2 | (byte)((int)(uint)bVar2 >> 4);
    lVar6 = _b3_1 + 1;
    if (bVar3 < 0x40) {
      (*out)[_b3_1 + 1] = bVar2 << 4 | (byte)((int)(uint)bVar3 >> 2);
      lVar6 = _b3_1 + 2;
    }
    _b3_1 = lVar6;
    if (bVar4 < 0x40) {
      (*out)[_b3_1] = bVar3 << 6 | bVar4;
    }
  }
  return (size_t)in_local;
}

Assistant:

size_t DecodeBase64(const char* in, size_t inLength, uint8_t*& out) {
    ai_assert(inLength % 4 == 0);

    if (inLength < 4) {
        out = 0;
        return 0;
    }

    int nEquals = int(in[inLength - 1] == '=') +
        int(in[inLength - 2] == '=');

    size_t outLength = (inLength * 3) / 4 - nEquals;
    out = new uint8_t[outLength];
    memset(out, 0, outLength);

    size_t i, j = 0;

    for (i = 0; i + 4 < inLength; i += 4) {
        uint8_t b0 = DecodeCharBase64(in[i]);
        uint8_t b1 = DecodeCharBase64(in[i + 1]);
        uint8_t b2 = DecodeCharBase64(in[i + 2]);
        uint8_t b3 = DecodeCharBase64(in[i + 3]);

        out[j++] = (uint8_t)((b0 << 2) | (b1 >> 4));
        out[j++] = (uint8_t)((b1 << 4) | (b2 >> 2));
        out[j++] = (uint8_t)((b2 << 6) | b3);
    }

    {
        uint8_t b0 = DecodeCharBase64(in[i]);
        uint8_t b1 = DecodeCharBase64(in[i + 1]);
        uint8_t b2 = DecodeCharBase64(in[i + 2]);
        uint8_t b3 = DecodeCharBase64(in[i + 3]);

        out[j++] = (uint8_t)((b0 << 2) | (b1 >> 4));
        if (b2 < 64) out[j++] = (uint8_t)((b1 << 4) | (b2 >> 2));
        if (b3 < 64) out[j++] = (uint8_t)((b2 << 6) | b3);
    }

    return outLength;
}